

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O2

float vector_utils::sum(vector<float,_std::allocator<float>_> *a)

{
  pointer pfVar1;
  int i;
  long lVar2;
  float fVar3;
  
  pfVar1 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar3 = 0.0;
  for (lVar2 = 0;
      (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_finish - (long)pfVar1 >> 2 != lVar2; lVar2 = lVar2 + 1) {
    fVar3 = fVar3 + pfVar1[lVar2];
  }
  return fVar3;
}

Assistant:

float vector_utils::sum(const std::vector<float>& a)
{
  float accumulator = 0.0f;

  for (auto i = 0; i < a.size(); ++i)
  {
    accumulator += a[i];
  }

  return accumulator;
}